

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int Synchronize_Field(FIELD *field)

{
  FORM *form;
  int iVar1;
  int iVar2;
  
  if (field != (FIELD *)0x0) {
    form = field->form;
    iVar1 = 0;
    iVar2 = 0;
    if ((((form != (FORM *)0x0) && (iVar2 = iVar1, (form->status & 1) != 0)) &&
        ((field->opts & 1) != 0)) && (field->page == form->curpage)) {
      if (form->current == field) {
        form->currow = 0;
        form->curcol = 0;
        form->toprow = 0;
        form->begincol = 0;
        werase(form->w);
        if ((((field->opts & 4U) == 0) || (field->just == 0)) ||
           (((int)field->rows + field->nrow != 1 ||
            ((((uint)field->opts >> 9 & 1) == 0 || (field->dcols != (int)field->cols)))))) {
          Buffer_To_Window(field,form->w);
        }
        else {
          Undo_Justification(field,form->w);
        }
        *(byte *)&field->status = (byte)field->status | 2;
        iVar2 = _nc_Refresh_Current_Field(form);
      }
      else {
        iVar2 = Display_Or_Erase_Field(field,false);
      }
    }
    *(byte *)&field->status = (byte)field->status | 1;
    return iVar2;
  }
  return -2;
}

Assistant:

static int Synchronize_Field(FIELD * field)
{
  FORM *form;
  int res = E_OK;

  if (!field)
    return(E_BAD_ARGUMENT);

  if (((form=field->form) != (FORM *)0)
      && Field_Really_Appears(field))
    {
      if (field == form->current)
        { 
          form->currow  = form->curcol = form->toprow = form->begincol = 0;
          werase(form->w);
      
          if ( (field->opts & O_PUBLIC) && Justification_Allowed(field) )
            Undo_Justification( field, form->w );
          else
            Buffer_To_Window( field, form->w );
          
          field->status |= _NEWTOP;
          res = _nc_Refresh_Current_Field( form );
        }
      else
        res = Display_Field( field );
    }
  field->status |= _CHANGED;
  return(res);
}